

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O0

void __thiscall Args::GroupIface::~GroupIface(GroupIface *this)

{
  code *pcVar1;
  GroupIface *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~GroupIface()
	{
	}